

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O2

bool vkt::tessellation::anon_unknown_0::PrimitiveSetInvariance::comparePrimitivesExact
               (PerPrimitive *primitivesA,PerPrimitive *primitivesB,int numPrimitivesPerPatch)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  
  uVar1 = 0;
  uVar2 = 0;
  if (0 < numPrimitivesPerPatch) {
    uVar2 = (ulong)(uint)numPrimitivesPerPatch;
  }
  iVar3 = 0;
  for (; uVar1 != uVar2; uVar1 = uVar1 + 1) {
    iVar4 = numPrimitivesPerPatch;
    do {
      do {
        do {
          iVar5 = iVar3;
          bVar6 = iVar4 == 0;
          iVar4 = iVar4 + -1;
          if (bVar6) goto LAB_007296fd;
          iVar3 = (iVar5 + 1) % numPrimitivesPerPatch;
          bVar6 = tcu::Vector<float,_4>::operator==
                            (primitivesA[uVar1].tessCoord,primitivesB[iVar5].tessCoord);
        } while (!bVar6);
        bVar6 = tcu::Vector<float,_4>::operator==
                          (primitivesA[uVar1].tessCoord + 1,primitivesB[iVar5].tessCoord + 1);
      } while (!bVar6);
      bVar6 = tcu::Vector<float,_4>::operator==
                        (primitivesA[uVar1].tessCoord + 2,primitivesB[iVar5].tessCoord + 2);
    } while (!bVar6);
  }
LAB_007296fd:
  return (long)numPrimitivesPerPatch <= (long)uVar1;
}

Assistant:

bool comparePrimitivesExact (const PerPrimitive* const primitivesA, const PerPrimitive* const primitivesB, const int numPrimitivesPerPatch)
{
	int ndxB = 0;
	for (int ndxA = 0; ndxA < numPrimitivesPerPatch; ++ndxA)
	{
		const tcu::Vec4 (&coordsA)[3] = primitivesA[ndxA].tessCoord;
		bool match = false;

		// Actually both sets are usually somewhat sorted, so don't reset ndxB after each match. Instead, continue from the next index.
		for (int i = 0; i < numPrimitivesPerPatch; ++i)
		{
			const tcu::Vec4 (&coordsB)[3] = primitivesB[ndxB].tessCoord;
			ndxB = (ndxB + 1) % numPrimitivesPerPatch;

			if (coordsA[0] == coordsB[0] && coordsA[1] == coordsB[1] && coordsA[2] == coordsB[2])
			{
				match = true;
				break;
			}
		}

		if (!match)
			return false;
	}
	return true;
}